

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

void __thiscall tonk::RefCounter::AppRelease(RefCounter *this)

{
  char *source;
  ErrorResult *in_RDI;
  undefined1 in_stack_ffffffffffffff4f;
  Result *in_stack_ffffffffffffff50;
  ErrorType in_stack_ffffffffffffff5c;
  string *desc;
  Result *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff94;
  RefCounter *in_stack_ffffffffffffff98;
  string local_48 [32];
  undefined8 local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  char *local_10;
  string *local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff98,"Application requested shutdown",
             (allocator *)&stack0xffffffffffffff97);
  desc = local_48;
  local_10 = "AppRelease";
  local_18 = &stack0xffffffffffffff98;
  local_1c = 0;
  local_28 = 0xc;
  local_8 = desc;
  source = (char *)operator_new(0x38);
  ErrorResult::ErrorResult
            (in_RDI,source,desc,in_stack_ffffffffffffff5c,(ErrorCodeT)in_stack_ffffffffffffff50);
  *(char **)desc = source;
  StartShutdown(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  Result::~Result(in_stack_ffffffffffffff50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
  return;
}

Assistant:

void RefCounter::AppRelease()
{
    // Begin disconnect if it has not happened yet
    StartShutdown(
        Tonk_AppRequest,
        Result("AppRelease", "Application requested shutdown", ErrorType::Tonk, Tonk_AppRequest));

    AppHoldsReference = false;
}